

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec32.c
# Opt level: O2

void chacha20_core_32(uint32_t *k,uint32_t *ctx,uint32_t ctr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint32_t *os;
  
  uVar3 = *(undefined8 *)ctx;
  uVar4 = *(undefined8 *)(ctx + 2);
  uVar5 = *(undefined8 *)(ctx + 4);
  uVar6 = *(undefined8 *)(ctx + 6);
  uVar7 = *(undefined8 *)(ctx + 8);
  uVar8 = *(undefined8 *)(ctx + 10);
  uVar9 = *(undefined8 *)(ctx + 0xe);
  *(undefined8 *)(k + 0xc) = *(undefined8 *)(ctx + 0xc);
  *(undefined8 *)(k + 0xe) = uVar9;
  *(undefined8 *)(k + 8) = uVar7;
  *(undefined8 *)(k + 10) = uVar8;
  *(undefined8 *)(k + 4) = uVar5;
  *(undefined8 *)(k + 6) = uVar6;
  *(undefined8 *)k = uVar3;
  *(undefined8 *)(k + 2) = uVar4;
  k[0xc] = k[0xc] + ctr;
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  *k = *k + *ctx;
  k[1] = k[1] + ctx[1];
  k[2] = k[2] + ctx[2];
  k[3] = k[3] + ctx[3];
  k[4] = k[4] + ctx[4];
  k[5] = k[5] + ctx[5];
  k[6] = k[6] + ctx[6];
  k[7] = k[7] + ctx[7];
  k[8] = k[8] + ctx[8];
  k[9] = k[9] + ctx[9];
  k[10] = k[10] + ctx[10];
  k[0xb] = k[0xb] + ctx[0xb];
  uVar1 = ctx[0xc];
  uVar2 = k[0xc];
  k[0xc] = uVar1 + uVar2;
  k[0xd] = k[0xd] + ctx[0xd];
  k[0xe] = k[0xe] + ctx[0xe];
  k[0xf] = k[0xf] + ctx[0xf];
  k[0xc] = uVar1 + uVar2 + ctr;
  return;
}

Assistant:

static inline void chacha20_core_32(uint32_t *k, uint32_t *ctx, uint32_t ctr)
{
  memcpy(k, ctx, 16U * sizeof (uint32_t));
  uint32_t ctr_u32 = 1U * ctr;
  uint32_t cv = ctr_u32;
  k[12U] = k[12U] + cv;
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  double_round_32(k);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = k;
    uint32_t x = k[i] + ctx[i];
    os[i] = x;);
  k[12U] = k[12U] + cv;
}